

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::analysis::ConstantManager::CreateCompositeInstruction
          (ConstantManager *this,uint32_t result_id,CompositeConstant *cc,uint32_t type_id)

{
  bool bVar1;
  int iVar2;
  Op OVar3;
  IRContext *pIVar4;
  DefUseManager *this_00;
  Instruction *this_01;
  undefined4 extraout_var;
  reference ppCVar5;
  TypeManager *this_02;
  Type *type_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ConstantManager *this_03;
  uint32_t in_R8D;
  uint32_t local_cc;
  Op local_ac;
  IRContext *local_a8;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t type;
  size_type local_90;
  spv_operand_type_t local_88 [2];
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t id;
  uint32_t component_type_id;
  Constant *component_const;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range2;
  uint32_t component_index;
  Instruction *type_inst;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t type_id_local;
  CompositeConstant *cc_local;
  ConstantManager *pCStack_18;
  uint32_t result_id_local;
  ConstantManager *this_local;
  
  this_03 = (ConstantManager *)CONCAT44(in_register_00000034,result_id);
  cc_local._4_4_ = SUB84(cc,0);
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_R8D;
  pCStack_18 = this_03;
  this_local = this;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&type_inst);
  pIVar4 = context(this_03);
  this_00 = IRContext::get_def_use_mgr(pIVar4);
  this_01 = DefUseManager::GetDef
                      (this_00,operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  __range2._4_4_ = 0;
  iVar2 = (*((Constant *)CONCAT44(in_register_0000000c,type_id))->_vptr_Constant[0x18])();
  __end2 = std::
           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)CONCAT44(extraout_var,iVar2));
  component_const =
       (Constant *)
       std::
       vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
       ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              *)CONCAT44(extraout_var,iVar2));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                *)&component_const);
    if (!bVar1) {
      if (operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        pIVar4 = context(this_03);
        this_02 = IRContext::get_type_mgr(pIVar4);
        type_00 = Constant::type((Constant *)CONCAT44(in_register_0000000c,type_id));
        local_cc = TypeManager::GetId(this_02,type_00);
      }
      else {
        local_cc = operands.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      local_a0 = local_cc;
      local_a8 = context(this_03);
      local_ac = OpConstantComposite;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int&,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>
                ((spvtools *)this,&local_a8,&local_ac,&local_a0,(uint *)((long)&cc_local + 4),
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &type_inst);
LAB_008f606f:
      local_88[1] = 1;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &type_inst);
      return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                )this;
    }
    ppCVar5 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              ::operator*(&__end2);
    _id = *ppCVar5;
    local_7c = 0;
    if ((this_01 == (Instruction *)0x0) ||
       (OVar3 = opt::Instruction::opcode(this_01), OVar3 != OpTypeStruct)) {
      if ((this_01 != (Instruction *)0x0) &&
         (OVar3 = opt::Instruction::opcode(this_01), OVar3 == OpTypeArray)) {
        local_7c = opt::Instruction::GetSingleWordInOperand(this_01,0);
      }
    }
    else {
      local_7c = opt::Instruction::GetSingleWordInOperand(this_01,__range2._4_4_);
    }
    local_80 = FindDeclaredConstant(this_03,_id,local_7c);
    if (local_80 == 0) {
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)this,(nullptr_t)0x0);
      goto LAB_008f606f;
    }
    local_88[0] = SPV_OPERAND_TYPE_ID;
    _type = &local_9c;
    local_90 = 1;
    local_9c = local_80;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&type_inst,
               local_88,(initializer_list<unsigned_int> *)&type);
    __range2._4_4_ = __range2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::unique_ptr<Instruction> ConstantManager::CreateCompositeInstruction(
    uint32_t result_id, const CompositeConstant* cc, uint32_t type_id) const {
  std::vector<Operand> operands;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  uint32_t component_index = 0;
  for (const Constant* component_const : cc->GetComponents()) {
    uint32_t component_type_id = 0;
    if (type_inst && type_inst->opcode() == spv::Op::OpTypeStruct) {
      component_type_id = type_inst->GetSingleWordInOperand(component_index);
    } else if (type_inst && type_inst->opcode() == spv::Op::OpTypeArray) {
      component_type_id = type_inst->GetSingleWordInOperand(0);
    }
    uint32_t id = FindDeclaredConstant(component_const, component_type_id);

    if (id == 0) {
      // Cannot get the id of the component constant, while all components
      // should have been added to the module prior to the composite constant.
      // Cannot create OpConstantComposite instruction in this case.
      return nullptr;
    }
    operands.emplace_back(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                          std::initializer_list<uint32_t>{id});
    component_index++;
  }
  uint32_t type =
      (type_id == 0) ? context()->get_type_mgr()->GetId(cc->type()) : type_id;
  return MakeUnique<Instruction>(context(), spv::Op::OpConstantComposite, type,
                                 result_id, std::move(operands));
}